

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O0

void __thiscall wasm::FuncCastEmulation::run(FuncCastEmulation *this,Module *module)

{
  bool bVar1;
  unsigned_long uVar2;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *this_00;
  pointer pEVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppEVar6;
  Function *pFVar7;
  pointer ppVar8;
  PassRunner *runner;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Function_*>,_false,_true>,_bool>
  pVar9;
  ParallelFuncCastEmulation local_310;
  uintptr_t local_1d0;
  Type local_1c8;
  Function *local_1c0;
  Function *thunk;
  char *pcStack_1b0;
  type_conflict1 *local_1a8;
  type_conflict1 *inserted;
  type *iter;
  undefined1 local_190;
  void *local_188;
  pair<const_wasm::Name,_wasm::Function_*> local_180;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Function_*>,_false,_true>,_bool>
  local_168;
  RefFunc *local_158;
  RefFunc *ref;
  reference puStack_148;
  Index i;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *__range2;
  unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  funcThunks;
  allocator<wasm::Type> local_e1;
  Type local_e0;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_d8;
  Type local_c0;
  Signature local_b8;
  HeapType local_a8;
  HeapType ABIType;
  string local_98;
  allocator<char> local_61;
  string local_60;
  string local_40;
  Index local_1c;
  Module *pMStack_18;
  Index numParams;
  Module *module_local;
  FuncCastEmulation *this_local;
  
  pMStack_18 = module;
  module_local = (Module *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"max-func-params",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"16",(allocator<char> *)((long)&ABIType.id + 7));
  Pass::getArgumentOrDefault(&local_40,&this->super_Pass,&local_60,&local_98);
  uVar2 = std::__cxx11::stoul(&local_40,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ABIType.id + 7));
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_1c = (Index)uVar2;
  wasm::Type::Type(&local_e0,i64);
  std::allocator<wasm::Type>::allocator(&local_e1);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            (&local_d8,uVar2 & 0xffffffff,&local_e0,&local_e1);
  wasm::Type::Type(&local_c0,&local_d8);
  wasm::Type::Type((Type *)&funcThunks._M_h._M_single_bucket,i64);
  Signature::Signature(&local_b8,local_c0,(Type)funcThunks._M_h._M_single_bucket);
  HeapType::HeapType(&local_a8,local_b8);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_d8);
  std::allocator<wasm::Type>::~allocator(&local_e1);
  std::
  unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  ::unordered_map((unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
                   *)&__range2);
  this_00 = &pMStack_18->elementSegments;
  __end2 = std::
           vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ::begin(this_00);
  segment = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
            std::
            vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                                     *)&segment), bVar1) {
    puStack_148 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                  ::operator*(&__end2);
    pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(puStack_148);
    bVar1 = wasm::Type::isFunction(&pEVar3->type);
    if (bVar1) {
      ref._4_4_ = 0;
      while( true ) {
        uVar4 = (ulong)ref._4_4_;
        pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 operator->(puStack_148);
        sVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                          (&pEVar3->data);
        if (sVar5 <= uVar4) break;
        pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 operator->(puStack_148);
        ppEVar6 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                            (&pEVar3->data,(ulong)ref._4_4_);
        local_158 = Expression::dynCast<wasm::RefFunc>(*ppEVar6);
        if (local_158 != (RefFunc *)0x0) {
          local_188 = (void *)0x0;
          std::pair<const_wasm::Name,_wasm::Function_*>::pair<wasm::Name_&,_std::nullptr_t,_true>
                    (&local_180,&local_158->func,&local_188);
          pVar9 = std::
                  unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
                  ::insert((unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
                            *)&__range2,&local_180);
          iter = (type *)pVar9.first.
                         super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true>
                         ._M_cur;
          local_190 = pVar9.second;
          local_168.first.
          super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true>._M_cur =
               (_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true>)
               (_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true>)iter;
          local_168.second = (bool)local_190;
          inserted = (type_conflict1 *)
                     std::
                     get<0ul,std::__detail::_Node_iterator<std::pair<wasm::Name_const,wasm::Function*>,false,true>,bool>
                               (&local_168);
          local_1a8 = std::
                      get<1ul,std::__detail::_Node_iterator<std::pair<wasm::Name_const,wasm::Function*>,false,true>,bool>
                                (&local_168);
          if ((*local_1a8 & 1U) != 0) {
            thunk = (Function *)(local_158->func).super_IString.str._M_len;
            pcStack_1b0 = (local_158->func).super_IString.str._M_str;
            pFVar7 = makeThunk(this,(Name)(local_158->func).super_IString.str,pMStack_18,local_1c);
            ppVar8 = std::__detail::
                     _Node_iterator<std::pair<const_wasm::Name,_wasm::Function_*>,_false,_true>::
                     operator->((_Node_iterator<std::pair<const_wasm::Name,_wasm::Function_*>,_false,_true>
                                 *)inserted);
            ppVar8->second = pFVar7;
          }
          ppVar8 = std::__detail::
                   _Node_iterator<std::pair<const_wasm::Name,_wasm::Function_*>,_false,_true>::
                   operator->((_Node_iterator<std::pair<const_wasm::Name,_wasm::Function_*>,_false,_true>
                               *)inserted);
          local_1c0 = ppVar8->second;
          wasm::Name::operator=(&local_158->func,(Name *)local_1c0);
          local_1d0 = (local_1c0->type).id;
          wasm::Type::Type(&local_1c8,(HeapType)local_1d0,NonNullable,Inexact);
          (local_158->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id =
               local_1c8.id;
        }
        ref._4_4_ = ref._4_4_ + 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
    ::operator++(&__end2);
  }
  ParallelFuncCastEmulation::ParallelFuncCastEmulation(&local_310,local_a8,local_1c);
  runner = Pass::getPassRunner(&this->super_Pass);
  WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
  ::run(&local_310.
         super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
        ,runner,pMStack_18);
  ParallelFuncCastEmulation::~ParallelFuncCastEmulation(&local_310);
  std::
  unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  ::~unordered_map((unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
                    *)&__range2);
  return;
}

Assistant:

void run(Module* module) override {
    Index numParams = std::stoul(getArgumentOrDefault("max-func-params", "16"));
    // we just need the one ABI function type for all indirect calls
    HeapType ABIType(
      Signature(Type(std::vector<Type>(numParams, Type::i64)), Type::i64));
    // Add a thunk for each function in the table, and do the call through it.
    std::unordered_map<Name, Function*> funcThunks;
    for (auto& segment : module->elementSegments) {
      if (!segment->type.isFunction()) {
        continue;
      }
      for (Index i = 0; i < segment->data.size(); ++i) {
        auto* ref = segment->data[i]->dynCast<RefFunc>();
        if (!ref) {
          continue;
        }
        auto [iter, inserted] = funcThunks.insert({ref->func, nullptr});
        if (inserted) {
          iter->second = makeThunk(ref->func, module, numParams);
        }
        auto* thunk = iter->second;
        ref->func = thunk->name;
        // TODO: Make this exact.
        ref->type = Type(thunk->type, NonNullable);
      }
    }

    // update call_indirects
    ParallelFuncCastEmulation(ABIType, numParams).run(getPassRunner(), module);
  }